

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_x509.cc
# Opt level: O3

int X509_print_ex(BIO *bp,X509 *x,ulong nmflag,ulong cflag)

{
  byte *pbVar1;
  X509_CINF *pXVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ASN1_INTEGER *a;
  X509_NAME *pXVar6;
  ASN1_TIME *pAVar7;
  EVP_PKEY *pkey;
  uint uVar8;
  int indent;
  long lVar9;
  uint64_t serial_u64;
  uint64_t local_38;
  
  uVar3 = (uint)nmflag & 0xf0000;
  iVar4 = 0xc;
  if (uVar3 != 0x40000) {
    iVar4 = 0;
  }
  uVar8 = 0x20;
  if (uVar3 == 0x40000) {
    uVar8 = 10;
  }
  indent = 0x10;
  if (nmflag != 0) {
    indent = iVar4;
  }
  pXVar2 = x->cert_info;
  if ((cflag & 1) == 0) {
    iVar4 = BIO_write(bp,"Certificate:\n",0xd);
    if (iVar4 < 1) {
      return 0;
    }
    iVar4 = BIO_write(bp,"    Data:\n",10);
    if (iVar4 < 1) {
      return 0;
    }
  }
  if ((cflag & 2) == 0) {
    uVar5 = X509_get_version((X509 *)x);
    if (2 < uVar5) {
      __assert_fail("X509_VERSION_1 <= l && l <= X509_VERSION_3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/t_x509.cc"
                    ,0x49,"int X509_print_ex(BIO *, X509 *, unsigned long, unsigned long)");
    }
    iVar4 = BIO_printf(bp,"%8sVersion: %ld (0x%lx)\n","",uVar5 + 1,uVar5);
    if (iVar4 < 1) {
      return 0;
    }
  }
  if ((cflag & 4) == 0) {
    iVar4 = BIO_write(bp,"        Serial Number:",0x16);
    if (iVar4 < 1) {
      return 0;
    }
    a = X509_get0_serialNumber((X509 *)x);
    iVar4 = ASN1_INTEGER_get_uint64(&local_38,a);
    if (iVar4 == 0) {
      ERR_clear_error();
      iVar4 = BIO_printf(bp,"\n%12s%s");
      if (iVar4 < 1) {
        return 0;
      }
      lVar9 = 0;
      while (lVar9 < a->length) {
        pbVar1 = a->data + lVar9;
        lVar9 = lVar9 + 1;
        iVar4 = BIO_printf(bp,"%02x%c",(ulong)*pbVar1);
        if (iVar4 < 1) {
          return 0;
        }
      }
    }
    else {
      if (a->type == 0x102) {
        __assert_fail("serial->type != V_ASN1_NEG_INTEGER",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/t_x509.cc"
                      ,0x57,"int X509_print_ex(BIO *, X509 *, unsigned long, unsigned long)");
      }
      iVar4 = BIO_printf(bp," %lu (0x%lx)\n",local_38);
      if (iVar4 < 1) {
        return 0;
      }
    }
  }
  if (((cflag & 8) == 0) &&
     (iVar4 = X509_signature_print(bp,pXVar2->signature,(ASN1_STRING *)0x0), iVar4 < 1)) {
    return 0;
  }
  if ((cflag & 0x10) == 0) {
    iVar4 = BIO_printf(bp,"        Issuer:%c",(ulong)uVar8);
    if (iVar4 < 1) {
      return 0;
    }
    pXVar6 = X509_get_issuer_name(x);
    iVar4 = X509_NAME_print_ex(bp,pXVar6,indent,nmflag);
    if (iVar4 < 0) {
      return 0;
    }
    iVar4 = BIO_write(bp,"\n",1);
    if (iVar4 < 1) {
      return 0;
    }
  }
  if ((cflag & 0x20) == 0) {
    iVar4 = BIO_write(bp,"        Validity\n",0x11);
    if (iVar4 < 1) {
      return 0;
    }
    iVar4 = BIO_write(bp,"            Not Before: ",0x18);
    if (iVar4 < 1) {
      return 0;
    }
    pAVar7 = X509_get_notBefore((X509 *)x);
    iVar4 = ASN1_TIME_print(bp,(ASN1_TIME *)pAVar7);
    if (iVar4 == 0) {
      return 0;
    }
    iVar4 = BIO_write(bp,"\n            Not After : ",0x19);
    if (iVar4 < 1) {
      return 0;
    }
    pAVar7 = X509_get_notAfter((X509 *)x);
    iVar4 = ASN1_TIME_print(bp,(ASN1_TIME *)pAVar7);
    if (iVar4 == 0) {
      return 0;
    }
    iVar4 = BIO_write(bp,"\n",1);
    if (iVar4 < 1) {
      return 0;
    }
  }
  if ((cflag & 0x40) == 0) {
    iVar4 = BIO_printf(bp,"        Subject:%c",(ulong)uVar8);
    if (iVar4 < 1) {
      return 0;
    }
    pXVar6 = X509_get_subject_name(x);
    iVar4 = X509_NAME_print_ex(bp,pXVar6,indent,nmflag);
    if (iVar4 < 0) {
      return 0;
    }
    iVar4 = BIO_write(bp,"\n",1);
    if (iVar4 < 1) {
      return 0;
    }
  }
  if (-1 < (char)cflag) {
    iVar4 = BIO_write(bp,"        Subject Public Key Info:\n",0x21);
    if (iVar4 < 1) {
      return 0;
    }
    iVar4 = BIO_printf(bp,"%12sPublic Key Algorithm: ","");
    if (iVar4 < 1) {
      return 0;
    }
    iVar4 = i2a_ASN1_OBJECT(bp,pXVar2->key->algor->algorithm);
    if (iVar4 < 1) {
      return 0;
    }
    iVar4 = BIO_puts(bp,"\n");
    if (iVar4 < 1) {
      return 0;
    }
    pkey = (EVP_PKEY *)X509_get0_pubkey((X509 *)x);
    if (pkey == (EVP_PKEY *)0x0) {
      BIO_printf(bp,"%12sUnable to load Public Key\n","");
      ERR_print_errors(bp);
    }
    else {
      EVP_PKEY_print_public(bp,pkey,0x10,(ASN1_PCTX *)0x0);
    }
  }
  uVar3 = (uint)cflag;
  if ((uVar3 >> 0xc & 1) == 0) {
    if (pXVar2->issuerUID != (ASN1_BIT_STRING *)0x0) {
      iVar4 = BIO_printf(bp,"%8sIssuer Unique ID: ","");
      if (iVar4 < 1) {
        return 0;
      }
      iVar4 = X509_signature_dump(bp,pXVar2->issuerUID,0xc);
      if (iVar4 == 0) {
        return 0;
      }
    }
    if (pXVar2->subjectUID != (ASN1_BIT_STRING *)0x0) {
      iVar4 = BIO_printf(bp,"%8sSubject Unique ID: ","");
      if (iVar4 < 1) {
        return 0;
      }
      iVar4 = X509_signature_dump(bp,pXVar2->subjectUID,0xc);
      if (iVar4 == 0) {
        return 0;
      }
    }
  }
  if ((uVar3 >> 8 & 1) == 0) {
    X509V3_extensions_print(bp,"X509v3 extensions",pXVar2->extensions,cflag,8);
  }
  if (((uVar3 >> 9 & 1) == 0) &&
     (iVar4 = X509_signature_print(bp,x->sig_alg,x->signature), iVar4 < 1)) {
    return 0;
  }
  if (((uVar3 >> 10 & 1) == 0) &&
     (iVar4 = X509_CERT_AUX_print(bp,(X509_CERT_AUX *)x->altname,0), iVar4 == 0)) {
    return 0;
  }
  return 1;
}

Assistant:

int X509_print_ex(BIO *bp, X509 *x, unsigned long nmflags,
                  unsigned long cflag) {
  char mlch = ' ';
  int nmindent = 0;
  if ((nmflags & XN_FLAG_SEP_MASK) == XN_FLAG_SEP_MULTILINE) {
    mlch = '\n';
    nmindent = 12;
  }

  if (nmflags == X509_FLAG_COMPAT) {
    nmindent = 16;
  }

  const X509_CINF *ci = x->cert_info;
  if (!(cflag & X509_FLAG_NO_HEADER)) {
    if (BIO_write(bp, "Certificate:\n", 13) <= 0) {
      return 0;
    }
    if (BIO_write(bp, "    Data:\n", 10) <= 0) {
      return 0;
    }
  }
  if (!(cflag & X509_FLAG_NO_VERSION)) {
    long l = X509_get_version(x);
    assert(X509_VERSION_1 <= l && l <= X509_VERSION_3);
    if (BIO_printf(bp, "%8sVersion: %ld (0x%lx)\n", "", l + 1,
                   (unsigned long)l) <= 0) {
      return 0;
    }
  }
  if (!(cflag & X509_FLAG_NO_SERIAL)) {
    if (BIO_write(bp, "        Serial Number:", 22) <= 0) {
      return 0;
    }

    const ASN1_INTEGER *serial = X509_get0_serialNumber(x);
    uint64_t serial_u64;
    if (ASN1_INTEGER_get_uint64(&serial_u64, serial)) {
      assert(serial->type != V_ASN1_NEG_INTEGER);
      if (BIO_printf(bp, " %" PRIu64 " (0x%" PRIx64 ")\n", serial_u64,
                     serial_u64) <= 0) {
        return 0;
      }
    } else {
      ERR_clear_error();  // Clear |ASN1_INTEGER_get_uint64|'s error.
      const char *neg =
          (serial->type == V_ASN1_NEG_INTEGER) ? " (Negative)" : "";
      if (BIO_printf(bp, "\n%12s%s", "", neg) <= 0) {
        return 0;
      }

      for (int i = 0; i < serial->length; i++) {
        if (BIO_printf(bp, "%02x%c", serial->data[i],
                       ((i + 1 == serial->length) ? '\n' : ':')) <= 0) {
          return 0;
        }
      }
    }
  }

  if (!(cflag & X509_FLAG_NO_SIGNAME)) {
    if (X509_signature_print(bp, ci->signature, NULL) <= 0) {
      return 0;
    }
  }

  if (!(cflag & X509_FLAG_NO_ISSUER)) {
    if (BIO_printf(bp, "        Issuer:%c", mlch) <= 0) {
      return 0;
    }
    if (X509_NAME_print_ex(bp, X509_get_issuer_name(x), nmindent, nmflags) <
        0) {
      return 0;
    }
    if (BIO_write(bp, "\n", 1) <= 0) {
      return 0;
    }
  }
  if (!(cflag & X509_FLAG_NO_VALIDITY)) {
    if (BIO_write(bp, "        Validity\n", 17) <= 0) {
      return 0;
    }
    if (BIO_write(bp, "            Not Before: ", 24) <= 0) {
      return 0;
    }
    if (!ASN1_TIME_print(bp, X509_get_notBefore(x))) {
      return 0;
    }
    if (BIO_write(bp, "\n            Not After : ", 25) <= 0) {
      return 0;
    }
    if (!ASN1_TIME_print(bp, X509_get_notAfter(x))) {
      return 0;
    }
    if (BIO_write(bp, "\n", 1) <= 0) {
      return 0;
    }
  }
  if (!(cflag & X509_FLAG_NO_SUBJECT)) {
    if (BIO_printf(bp, "        Subject:%c", mlch) <= 0) {
      return 0;
    }
    if (X509_NAME_print_ex(bp, X509_get_subject_name(x), nmindent, nmflags) <
        0) {
      return 0;
    }
    if (BIO_write(bp, "\n", 1) <= 0) {
      return 0;
    }
  }
  if (!(cflag & X509_FLAG_NO_PUBKEY)) {
    if (BIO_write(bp, "        Subject Public Key Info:\n", 33) <= 0) {
      return 0;
    }
    if (BIO_printf(bp, "%12sPublic Key Algorithm: ", "") <= 0) {
      return 0;
    }
    if (i2a_ASN1_OBJECT(bp, ci->key->algor->algorithm) <= 0) {
      return 0;
    }
    if (BIO_puts(bp, "\n") <= 0) {
      return 0;
    }

    const EVP_PKEY *pkey = X509_get0_pubkey(x);
    if (pkey == NULL) {
      BIO_printf(bp, "%12sUnable to load Public Key\n", "");
      ERR_print_errors(bp);
    } else {
      EVP_PKEY_print_public(bp, pkey, 16, NULL);
    }
  }

  if (!(cflag & X509_FLAG_NO_IDS)) {
    if (ci->issuerUID) {
      if (BIO_printf(bp, "%8sIssuer Unique ID: ", "") <= 0) {
        return 0;
      }
      if (!X509_signature_dump(bp, ci->issuerUID, 12)) {
        return 0;
      }
    }
    if (ci->subjectUID) {
      if (BIO_printf(bp, "%8sSubject Unique ID: ", "") <= 0) {
        return 0;
      }
      if (!X509_signature_dump(bp, ci->subjectUID, 12)) {
        return 0;
      }
    }
  }

  if (!(cflag & X509_FLAG_NO_EXTENSIONS)) {
    X509V3_extensions_print(bp, "X509v3 extensions", ci->extensions, cflag, 8);
  }

  if (!(cflag & X509_FLAG_NO_SIGDUMP)) {
    if (X509_signature_print(bp, x->sig_alg, x->signature) <= 0) {
      return 0;
    }
  }
  if (!(cflag & X509_FLAG_NO_AUX)) {
    if (!X509_CERT_AUX_print(bp, x->aux, 0)) {
      return 0;
    }
  }

  return 1;
}